

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  undefined8 *puVar1;
  size_type *psVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer ppTVar5;
  int iVar6;
  tm *ptVar7;
  long *plVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  UnitTestImpl *pUVar11;
  bool bVar12;
  ulong *puVar13;
  TimeInMillis ms;
  pointer ppTVar14;
  pointer ppTVar15;
  ulong uVar16;
  undefined8 uVar17;
  uint uVar18;
  long lVar19;
  tm time_struct;
  string kIndent;
  string kTestsuites;
  undefined1 local_2f0 [56];
  string local_2b8;
  string local_298;
  string local_278;
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  ulong *local_218;
  long local_210;
  ulong local_208;
  long lStack_200;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 *local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  int local_74;
  string local_70;
  string local_50;
  
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"testsuites","");
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_298,'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  pcVar3 = local_2f0 + 0x10;
  local_2f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"tests","");
  iVar6 = UnitTestImpl::reportable_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_278,(string *)local_2f0,iVar6,&local_298,true);
  if ((char *)local_2f0._0_8_ != pcVar3) {
    operator_delete((void *)local_2f0._0_8_);
  }
  local_2f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"failures","");
  iVar6 = UnitTestImpl::failed_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_278,(string *)local_2f0,iVar6,&local_298,true);
  if ((char *)local_2f0._0_8_ != pcVar3) {
    operator_delete((void *)local_2f0._0_8_);
  }
  local_2f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"disabled","");
  iVar6 = UnitTestImpl::reportable_disabled_test_count(unit_test->impl_);
  OutputJsonKey(stream,&local_278,(string *)local_2f0,iVar6,&local_298,true);
  if ((char *)local_2f0._0_8_ != pcVar3) {
    operator_delete((void *)local_2f0._0_8_);
  }
  local_2f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"errors","");
  OutputJsonKey(stream,&local_278,(string *)local_2f0,0,&local_298,true);
  if ((char *)local_2f0._0_8_ != pcVar3) {
    operator_delete((void *)local_2f0._0_8_);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    local_2f0._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"random_seed","");
    OutputJsonKey(stream,&local_278,(string *)local_2f0,unit_test->impl_->random_seed_,&local_298,
                  true);
    if ((char *)local_2f0._0_8_ != pcVar3) {
      operator_delete((void *)local_2f0._0_8_);
    }
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"timestamp","");
  local_2b8._M_dataplus._M_p = (pointer)(unit_test->impl_->start_timestamp_ / 1000);
  ptVar7 = localtime_r((time_t *)&local_2b8,(tm *)local_2f0);
  if (ptVar7 == (tm *)0x0) {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_allocated_capacity =
         local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
    goto LAB_0012ba9e;
  }
  local_74 = local_2f0._20_4_ + 0x76c;
  StreamableToString<int>(&local_50,&local_74);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_248 = *puVar13;
    lStack_240 = plVar8[3];
    local_258 = &local_248;
  }
  else {
    local_248 = *puVar13;
    local_258 = (ulong *)*plVar8;
  }
  local_250 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_98,(String *)(ulong)(local_2f0._16_4_ + 1),(int)local_250);
  uVar16 = 0xf;
  if (local_258 != &local_248) {
    uVar16 = local_248;
  }
  if (uVar16 < local_98._M_string_length + local_250) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar17 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_98._M_string_length + local_250) goto LAB_0012b34f;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_258);
  }
  else {
LAB_0012b34f:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_98._M_dataplus._M_p);
  }
  local_1f8 = &local_1e8;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_1e8 = *puVar1;
    uStack_1e0 = puVar9[3];
  }
  else {
    local_1e8 = *puVar1;
    local_1f8 = (undefined8 *)*puVar9;
  }
  local_1f0 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_228 = *puVar13;
    lStack_220 = plVar8[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *puVar13;
    local_238 = (ulong *)*plVar8;
  }
  local_230 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_b8,(String *)(ulong)(uint)local_2f0._12_4_,(int)local_230);
  uVar16 = 0xf;
  if (local_238 != &local_228) {
    uVar16 = local_228;
  }
  if (uVar16 < local_b8._M_string_length + local_230) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar17 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_b8._M_string_length + local_230) goto LAB_0012b495;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_238);
  }
  else {
LAB_0012b495:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_b8._M_dataplus._M_p);
  }
  local_1d8 = &local_1c8;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_1c8 = *puVar1;
    uStack_1c0 = puVar9[3];
  }
  else {
    local_1c8 = *puVar1;
    local_1d8 = (undefined8 *)*puVar9;
  }
  local_1d0 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_208 = *puVar13;
    lStack_200 = plVar8[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *puVar13;
    local_218 = (ulong *)*plVar8;
  }
  local_210 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_d8,(String *)(ulong)(uint)local_2f0._8_4_,(int)local_210);
  uVar16 = 0xf;
  if (local_218 != &local_208) {
    uVar16 = local_208;
  }
  if (uVar16 < local_d8._M_string_length + local_210) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      uVar17 = local_d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_d8._M_string_length + local_210) goto LAB_0012b5db;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_218);
  }
  else {
LAB_0012b5db:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_d8._M_dataplus._M_p);
  }
  local_1b8 = &local_1a8;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_1a8 = *puVar1;
    uStack_1a0 = puVar9[3];
  }
  else {
    local_1a8 = *puVar1;
    local_1b8 = (undefined8 *)*puVar9;
  }
  local_1b0 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_168 = *puVar13;
    lStack_160 = plVar8[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar13;
    local_178 = (ulong *)*plVar8;
  }
  local_170 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_f8,(String *)((ulong)local_2f0._0_8_ >> 0x20),(int)local_170);
  uVar16 = 0xf;
  if (local_178 != &local_168) {
    uVar16 = local_168;
  }
  if (uVar16 < local_f8._M_string_length + local_170) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar17 = local_f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_f8._M_string_length + local_170) goto LAB_0012b721;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_178);
  }
  else {
LAB_0012b721:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_f8._M_dataplus._M_p);
  }
  local_198 = &local_188;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_188 = *puVar1;
    uStack_180 = puVar9[3];
  }
  else {
    local_188 = *puVar1;
    local_198 = (undefined8 *)*puVar9;
  }
  local_190 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_148 = *puVar13;
    lStack_140 = plVar8[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar13;
    local_158 = (ulong *)*plVar8;
  }
  local_150 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_118,(String *)(local_2f0._0_8_ & 0xffffffff),(int)local_150);
  uVar16 = 0xf;
  if (local_158 != &local_148) {
    uVar16 = local_148;
  }
  if (uVar16 < local_118._M_string_length + local_150) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      uVar17 = local_118.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_118._M_string_length + local_150) goto LAB_0012b869;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_158);
  }
  else {
LAB_0012b869:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_118._M_dataplus._M_p);
  }
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  psVar2 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_2b8.field_2._M_allocated_capacity = *psVar2;
    local_2b8.field_2._8_8_ = puVar9[3];
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar2;
    local_2b8._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_2b8._M_string_length = puVar9[1];
  *puVar9 = psVar2;
  puVar9[1] = 0;
  *(undefined1 *)psVar2 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_138.field_2._M_allocated_capacity = *puVar13;
    local_138.field_2._8_8_ = plVar8[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *puVar13;
    local_138._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_138._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
LAB_0012ba9e:
  OutputJsonKey(stream,&local_278,&local_70,&local_138,&local_298,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_2f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"time","");
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_2b8,(internal *)unit_test->impl_->elapsed_time_,ms)
  ;
  OutputJsonKey(stream,&local_278,(string *)local_2f0,&local_2b8,&local_298,false);
  paVar4 = &local_2b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar4) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((char *)local_2f0._0_8_ != pcVar3) {
    operator_delete((void *)local_2f0._0_8_);
  }
  TestPropertiesAsJson((string *)local_2f0,&unit_test->impl_->ad_hoc_test_result_,&local_298);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (stream,(char *)local_2f0._0_8_,CONCAT44(local_2f0._12_4_,local_2f0._8_4_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,",\n",2);
  if ((char *)local_2f0._0_8_ != pcVar3) {
    operator_delete((void *)local_2f0._0_8_);
  }
  local_2f0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"name","");
  local_2b8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"AllTests","");
  OutputJsonKey(stream,&local_278,(string *)local_2f0,&local_2b8,&local_298,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar4) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((char *)local_2f0._0_8_ != pcVar3) {
    operator_delete((void *)local_2f0._0_8_);
  }
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (stream,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_278._M_dataplus._M_p,local_278._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\": [\n",5);
  pUVar11 = unit_test->impl_;
  ppTVar14 = (pUVar11->test_cases_).
             super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar11->test_cases_).
                              super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar14) >> 3)) {
    lVar19 = 0;
    bVar12 = false;
    do {
      ppTVar15 = (ppTVar14[lVar19]->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar5 = *(pointer *)
                 ((long)&(ppTVar14[lVar19]->test_info_list_).
                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                         ._M_impl + 8);
      if (ppTVar15 != ppTVar5) {
        iVar6 = 0;
        do {
          uVar18 = (*ppTVar15)->is_in_another_shard_ ^ 1;
          if ((*ppTVar15)->matches_filter_ == false) {
            uVar18 = 0;
          }
          iVar6 = iVar6 + uVar18;
          ppTVar15 = ppTVar15 + 1;
        } while (ppTVar15 != ppTVar5);
        if (iVar6 != 0) {
          if (bVar12) {
            std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
            pUVar11 = unit_test->impl_;
          }
          PrintJsonTestCase(stream,(pUVar11->test_cases_).
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar19]);
          pUVar11 = unit_test->impl_;
          bVar12 = true;
        }
      }
      lVar19 = lVar19 + 1;
      ppTVar14 = (pUVar11->test_cases_).
                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (lVar19 < (int)((ulong)((long)(pUVar11->test_cases_).
                                          super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppTVar14) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (stream,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}